

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

bool __thiscall Parser::dcl(Parser *this)

{
  pointer *pppFVar1;
  iterator __position;
  bool bVar2;
  FunctionNode *pFVar3;
  FunctionNode *f;
  FunctionNode *local_18;
  
  bVar2 = is_builtin_type(this);
  if ((bVar2) && (pFVar3 = function_definition(this), pFVar3 != (FunctionNode *)0x0)) {
    __position._M_current =
         (this->data).functions.super__Vector_base<FunctionNode_*,_std::allocator<FunctionNode_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->data).functions.super__Vector_base<FunctionNode_*,_std::allocator<FunctionNode_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_18 = pFVar3;
      std::vector<FunctionNode*,std::allocator<FunctionNode*>>::
      _M_realloc_insert<FunctionNode*const&>
                ((vector<FunctionNode*,std::allocator<FunctionNode*>> *)&(this->data).functions,
                 __position,&local_18);
    }
    else {
      *__position._M_current = pFVar3;
      pppFVar1 = &(this->data).functions.
                  super__Vector_base<FunctionNode_*,_std::allocator<FunctionNode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppFVar1 = *pppFVar1 + 1;
    }
    if (pFVar3 != (FunctionNode *)0x0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Parser::dcl()
{
  if (is_builtin_type()) {
    FunctionNode* f = function_definition();
    if (f) {
      data.functions.push_back(f);
      return true;
    }
  }

  return false;
}